

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_view_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitTest_x_iutest_x_PrintStringViewConvertible_Test::Body
          (iu_UnitTest_x_iutest_x_PrintStringViewConvertible_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Fixed *fixed;
  type **in_stack_fffffffffffffb68;
  AssertionHelper local_460;
  StringViewConvertible local_430;
  Fixed local_410;
  AssertionHelper local_288;
  Fixed local_258;
  string local_d0;
  undefined1 local_b0 [8];
  AssertionResult iutest_ar;
  undefined1 local_78 [8];
  StringViewConvertible v;
  LogChecker ck;
  iu_UnitTest_x_iutest_x_PrintStringViewConvertible_Test *this_local;
  
  LogChecker::LogChecker((LogChecker *)((long)&v.name.field_2 + 8),"ABC");
  StringViewConvertible::StringViewConvertible((StringViewConvertible *)local_78);
  iutest::detail::AlwaysZero();
  pcVar2 = LogCheckerBase::operator_cast_to_char_((LogCheckerBase *)((long)&v.name.field_2 + 8));
  iutest::PrintToString<StringViewConvertible>(&local_d0,(StringViewConvertible *)local_78);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_b0,(internal *)"static_cast<const char*>(ck)",
             "::iutest::PrintToString(v)",pcVar2,(char *)&local_d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffb68);
  std::__cxx11::string::~string((string *)&local_d0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    memset(&local_258,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_258);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_b0);
    iutest::AssertionHelper::AssertionHelper
              (&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_view_tests.cpp"
               ,0x77,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_288,&local_258);
    iutest::AssertionHelper::~AssertionHelper(&local_288);
    iutest::AssertionHelper::Fixed::~Fixed(&local_258);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  memset(&local_410,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_410);
  StringViewConvertible::StringViewConvertible(&local_430,(StringViewConvertible *)local_78);
  fixed = iutest::AssertionHelper::Fixed::operator<<(&local_410,&local_430);
  iutest::AssertionHelper::AssertionHelper
            (&local_460,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_view_tests.cpp"
             ,0x78,"Succeeded.\n",kSuccess);
  iutest::AssertionHelper::operator=(&local_460,fixed);
  iutest::AssertionHelper::~AssertionHelper(&local_460);
  StringViewConvertible::~StringViewConvertible(&local_430);
  iutest::AssertionHelper::Fixed::~Fixed(&local_410);
  StringViewConvertible::~StringViewConvertible((StringViewConvertible *)local_78);
  LogChecker::~LogChecker((LogChecker *)((long)&v.name.field_2 + 8));
  return;
}

Assistant:

IUTEST(UnitTest, PrintStringViewConvertible)
{
#if !defined(IUTEST_NO_ARGUMENT_DEPENDENT_LOOKUP)
    LogChecker ck("ABC");
#else
    LogChecker ck("-Byte object");
#endif
    StringViewConvertible v;
    IUTEST_PRINTTOSTRING_CHECK(ck, v);
    IUTEST_STREAMOUT_CHECK(v);
}